

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::AssertionResult::getExpression_abi_cxx11_(AssertionResult *this)

{
  bool bVar1;
  StringRef *in_RSI;
  string *in_RDI;
  string *expr;
  string *lhs;
  
  lhs = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  StringRef::size(in_RSI + 2);
  std::__cxx11::string::reserve((ulong)lhs);
  bVar1 = isFalseTest(*(int *)&in_RSI[3].m_start);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)lhs,"!(");
  }
  operator+=(lhs,in_RSI);
  bVar1 = isFalseTest(*(int *)&in_RSI[3].m_start);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)lhs,')');
  }
  return in_RDI;
}

Assistant:

std::string AssertionResult::getExpression() const {
        // Possibly overallocating by 3 characters should be basically free
        std::string expr; expr.reserve(m_info.capturedExpression.size() + 3);
        if (isFalseTest(m_info.resultDisposition)) {
            expr += "!(";
        }
        expr += m_info.capturedExpression;
        if (isFalseTest(m_info.resultDisposition)) {
            expr += ')';
        }
        return expr;
    }